

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int ffiprs(fitsfile *fptr,int compressed,char *expr,int maxdim,int *datatype,long *nelem,int *naxis,
          long *naxes,ParseData *lParse,int *status)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  int *piVar6;
  int in_ECX;
  char *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  yyscan_t *in_R8;
  long *in_R9;
  int *in_stack_00000008;
  PixelFilter *pixFilter;
  yyscan_t yylex_scanner;
  long xaxes [9];
  char *in_stack_00000068;
  int bitpix;
  int xaxis;
  int tstatus;
  int lexpr;
  int i;
  Node *result;
  ParseData *in_stack_00006a38;
  yyscan_t in_stack_00006a40;
  long *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  fitsfile *fptr_00;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  fitsfile *in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  long *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  fitsfile *in_stack_ffffffffffffff98;
  uint local_50;
  int local_48;
  int local_44;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  if (*(int *)xaxes[0] == 0) {
    iVar3 = ffrdef((fitsfile *)xaxes[5],(int *)xaxes[4]);
    if (iVar3 == 0) {
      fptr_00 = *(fitsfile **)((long)yylex_scanner + 0xb0);
      memset(yylex_scanner,0,0xe8);
      *(fitsfile **)((long)yylex_scanner + 0xb0) = fptr_00;
      *(undefined8 *)yylex_scanner = in_RDI;
      *(undefined4 *)((long)yylex_scanner + 0x18) = in_ESI;
      *(undefined4 *)((long)yylex_scanner + 0x60) = 0;
      *(undefined8 *)((long)yylex_scanner + 0xa0) = 0;
      *(undefined8 *)((long)yylex_scanner + 0xa8) = 0;
      *(code **)((long)yylex_scanner + 8) = find_column;
      *(code **)((long)yylex_scanner + 0x10) = load_column;
      *(undefined8 *)((long)yylex_scanner + 0x38) = 0;
      *(undefined4 *)((long)yylex_scanner + 0x44) = 0;
      *(undefined4 *)((long)yylex_scanner + 0x40) = 0;
      *(undefined4 *)((long)yylex_scanner + 0xdc) = 0;
      *(undefined4 *)((long)yylex_scanner + 0xe0) = 0;
      ffghdt(fptr_00,(int *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             (int *)in_stack_ffffffffffffff38);
      if (*(int *)((long)yylex_scanner + 0xdc) == 0) {
        ffgipr(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,&fptr_00->HDUposition,
               (int *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38,(int *)0x1337c9);
        if (*(int *)xaxes[0] != 0) {
          ffpmsg((char *)0x1337e2);
          return *(int *)xaxes[0];
        }
        *(long *)((long)yylex_scanner + 200) = (long)(int)(uint)(0 < (int)local_50);
        for (local_44 = 0; local_44 < (int)local_50; local_44 = local_44 + 1) {
          *(long *)((long)yylex_scanner + 200) =
               *(long *)(&stack0xffffffffffffff58 + (long)local_44 * 8) *
               *(long *)((long)yylex_scanner + 200);
        }
        if (DEBUG_PIXFILTER != 0) {
          printf("naxis=%d, lParse->totalRows=%ld\n",(ulong)local_50,
                 *(undefined8 *)((long)yylex_scanner + 200));
        }
      }
      else {
        iVar3 = ffgkyj(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                       ,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        if (iVar3 != 0) {
          *(undefined8 *)((long)yylex_scanner + 200) = 0;
        }
      }
      if (*in_RDX == '@') {
        iVar3 = ffimport_file(in_stack_00000068,(char **)xaxes[8],(int *)xaxes[7]);
        if (iVar3 != 0) {
          return *(int *)xaxes[0];
        }
        sVar4 = strlen(*(char **)((long)yylex_scanner + 0x28));
        local_48 = (int)sVar4;
      }
      else {
        sVar4 = strlen(in_RDX);
        local_48 = (int)sVar4;
        pvVar5 = malloc((long)(local_48 + 2));
        *(void **)((long)yylex_scanner + 0x28) = pvVar5;
        strcpy(*(char **)((long)yylex_scanner + 0x28),in_RDX);
      }
      strcat((char *)(*(long *)((long)yylex_scanner + 0x28) + (long)local_48),"\n");
      *(undefined4 *)((long)yylex_scanner + 0x30) = 0;
      *(undefined4 *)((long)yylex_scanner + 0x34) = 0;
      fits_parser_yylex_init_extra((ParseData *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8);
      fits_parser_yyrestart
                ((FILE *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),fptr_00);
      iVar3 = fits_parser_yyparse(in_stack_00006a40,in_stack_00006a38);
      *(int *)xaxes[0] = iVar3;
      fits_parser_yylex_destroy
                ((yyscan_t)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      if (*(int *)xaxes[0] == 0) {
        *(undefined4 *)xaxes[0] = *(undefined4 *)((long)yylex_scanner + 0xe0);
        if (*(int *)xaxes[0] == 0) {
          if (*(int *)((long)yylex_scanner + 0x40) == 0) {
            ffpmsg((char *)0x133aa1);
            *(undefined4 *)xaxes[0] = 0x1af;
            local_4 = 0x1af;
          }
          else {
            if (*(int *)((long)yylex_scanner + 0x60) == 0) {
              pvVar5 = malloc(0x110);
              *(void **)((long)yylex_scanner + 0xa0) = pvVar5;
              if (*(long *)((long)yylex_scanner + 0xa0) == 0) {
                ffpmsg((char *)0x133b0b);
                *(undefined4 *)xaxes[0] = 0x71;
                return 0x71;
              }
              memset(*(void **)((long)yylex_scanner + 0xa0),0,0x110);
              **(undefined8 **)((long)yylex_scanner + 0xa0) = in_RDI;
            }
            piVar6 = (int *)(*(long *)((long)yylex_scanner + 0x38) +
                            (long)*(int *)((long)yylex_scanner + 0x48) * 0x180);
            iVar3 = piVar6[0x12];
            *(int *)((long)yylex_scanner + 0x70) = iVar3;
            *in_stack_00000008 = iVar3;
            lVar1 = *(long *)(piVar6 + 0x10);
            *(long *)((long)yylex_scanner + 0x68) = lVar1;
            *in_R9 = lVar1;
            for (local_44 = 0; local_44 < *in_stack_00000008 && local_44 < in_ECX;
                local_44 = local_44 + 1) {
              uVar2 = *(undefined8 *)(piVar6 + (long)local_44 * 2 + 0x14);
              *(undefined8 *)((long)yylex_scanner + (long)local_44 * 8 + 0x78) = uVar2;
              *(undefined8 *)(pixFilter->keyword + (long)local_44 * 8 + -0x40) = uVar2;
            }
            switch(piVar6[0xf]) {
            case 0x102:
              *(undefined4 *)in_R8 = 0xe;
              break;
            case 0x103:
              *(undefined4 *)in_R8 = 0x29;
              break;
            case 0x104:
              *(undefined4 *)in_R8 = 0x52;
              break;
            case 0x105:
              *(undefined4 *)in_R8 = 0x10;
              break;
            case 0x106:
              *(undefined4 *)in_R8 = 1;
              break;
            default:
              *(undefined4 *)in_R8 = 0;
              ffpmsg((char *)0x133cfb);
              *(undefined4 *)((long)yylex_scanner + 0xe0) = 0x1b0;
              *(undefined4 *)xaxes[0] = 0x1b0;
            }
            *(undefined4 *)((long)yylex_scanner + 0xd8) = *(undefined4 *)in_R8;
            if (*(long *)((long)yylex_scanner + 0x28) == 0) {
              printf("invalid free(lParse->expr) at %s:%d\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                     ,0x3ad);
            }
            else {
              free(*(void **)((long)yylex_scanner + 0x28));
            }
            if (*piVar6 == -1000) {
              *in_R9 = -*in_R9;
            }
            local_4 = *(int *)xaxes[0];
          }
        }
        else {
          local_4 = *(int *)xaxes[0];
        }
      }
      else {
        *(undefined4 *)xaxes[0] = 0x1af;
        local_4 = 0x1af;
      }
    }
    else {
      local_4 = *(int *)xaxes[0];
    }
  }
  else {
    local_4 = *(int *)xaxes[0];
  }
  return local_4;
}

Assistant:

int ffiprs( fitsfile *fptr,      /* I - Input FITS file                     */
            int      compressed, /* I - Is FITS file hkunexpanded?          */
            char     *expr,      /* I - Arithmetic expression               */
            int      maxdim,     /* I - Max Dimension of naxes              */
            int      *datatype,  /* O - Data type of result                 */
            long     *nelem,     /* O - Vector length of result             */
            int      *naxis,     /* O - # of dimensions of result           */
            long     *naxes,     /* O - Size of each dimension              */
	    ParseData *lParse,   /* O - parser status                       */
            int      *status )   /* O - Error status                        */
/*                                                                          */
/* Initialize the parser and determine what type of result the expression   */
/* produces.                                                                */
/*--------------------------------------------------------------------------*/
{
   Node *result;
   int  i,lexpr, tstatus = 0;
   int xaxis, bitpix;
   long xaxes[9];
   yyscan_t yylex_scanner; /* Used internally by FLEX lexer */
   PixelFilter *pixFilter = 0;

   if( *status ) return( *status );

   /* make sure all internal structures for this HDU are current */
   if ( ffrdef(fptr, status) ) return(*status);

   /*  Initialize the Parser structure  */

   /* Unfortunately we need to preserve the pixFilter value since it
      is pre-set when ffiprs() is called */
   pixFilter = lParse->pixFilter;
   memset(lParse, 0, sizeof(*lParse));
   lParse->pixFilter = pixFilter;

   lParse->def_fptr   = fptr;
   lParse->compressed = compressed;
   lParse->nCols      = 0;
   lParse->colData    = NULL;
   lParse->varData    = NULL;
   lParse->getData    = find_column;
   lParse->loadData   = load_column;
   lParse->Nodes      = NULL;
   lParse->nNodesAlloc= 0;
   lParse->nNodes     = 0;
   lParse->hdutype    = 0;
   lParse->status     = 0;

   fits_get_hdu_type(fptr, &(lParse->hdutype), status );

   if (lParse->hdutype == IMAGE_HDU) {

      fits_get_img_param(fptr, 9, &bitpix, &xaxis, xaxes, status);
      if (*status) {
         ffpmsg("ffiprs: unable to get image dimensions");
         return( *status );
      }
      lParse->totalRows = xaxis > 0 ? 1 : 0;
      for (i = 0; i < xaxis; ++i)
         lParse->totalRows *= xaxes[i];
      if (DEBUG_PIXFILTER)
         printf("naxis=%d, lParse->totalRows=%ld\n", xaxis, lParse->totalRows);
   }
   else if( ffgkyj(fptr, "NAXIS2", &lParse->totalRows, 0, &tstatus) )
   {
      /* this might be a 1D or null image with no NAXIS2 keyword */
      lParse->totalRows = 0;
   } 
   

   /*  Copy expression into parser... read from file if necessary  */


   if( expr[0]=='@' ) {
      if( ffimport_file( expr+1, &lParse->expr, status ) ) return( *status );
      lexpr = strlen(lParse->expr);
   } else {
      lexpr = strlen(expr);
      lParse->expr = (char*)malloc( (2+lexpr)*sizeof(char));
      strcpy(lParse->expr,expr);
   }
   strcat(lParse->expr + lexpr,"\n");
   lParse->index    = 0;
   lParse->is_eobuf = 0;

   /*  Parse the expression, building the Nodes and determing  */
   /*  which columns are needed and what data type is returned  */
   
   fits_parser_yylex_init_extra(lParse, &yylex_scanner);
   fits_parser_yyrestart(NULL, yylex_scanner);
   *status = fits_parser_yyparse(yylex_scanner, lParse);
   fits_parser_yylex_destroy(yylex_scanner);

   if( *status  ) return( *status = PARSE_SYNTAX_ERR );

   /*  Check results  */
   *status = lParse->status;
   if( *status ) return(*status);

   if( !lParse->nNodes ) {
      ffpmsg("Blank expression");
      return( *status = PARSE_SYNTAX_ERR );
   }
   if( !lParse->nCols ) {
     lParse->colData = (iteratorCol *) malloc(sizeof(iteratorCol));
     if (lParse->colData == 0) {
       ffpmsg("memory allocation failed (ffiprs)");
       return( *status = MEMORY_ALLOCATION );
     }
     /* This allows iterator to know value of */ 
     /* fptr when no columns are referenced   */
     memset(lParse->colData, 0, sizeof(iteratorCol));
     lParse->colData[0].fptr = fptr;
   }

   result = lParse->Nodes + lParse->resultNode;

   *naxis = lParse->nAxis     = result->value.naxis;
   *nelem = lParse->nElements = result->value.nelem;
   for( i=0; i<*naxis && i<maxdim; i++ )
      naxes[i] = lParse->nAxes[i] = result->value.naxes[i];

   switch( result->type ) {
   case BOOLEAN:
      *datatype = TLOGICAL;
      break;
   case LONG:
      *datatype = TLONG;
      break;
   case DOUBLE:
      *datatype = TDOUBLE;
      break;
   case BITSTR:
      *datatype = TBIT;
      break;
   case STRING:
      *datatype = TSTRING;
      break;
   default:
      *datatype = 0;
      ffpmsg("Bad return data type");
      *status = lParse->status = PARSE_BAD_TYPE;
      break;
   }
   lParse->datatype = *datatype;
   FREE(lParse->expr);

   if( result->operation==CONST_OP ) *nelem = - *nelem;
   return(*status);
}